

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::cftfsub(int n,double *a,int *ip,int nw,double *w)

{
  int in_ECX;
  double *in_RDX;
  double *in_RSI;
  int in_EDI;
  double *in_R8;
  undefined4 in_stack_00000020;
  double *in_stack_00000048;
  double *in_stack_00000050;
  int in_stack_0000005c;
  double *in_stack_000000a8;
  double *in_stack_000000b0;
  int n_00;
  undefined4 in_stack_fffffffffffffff8;
  
  if (in_EDI < 9) {
    if (in_EDI == 8) {
      cftf040(in_RSI);
    }
    else if (in_EDI == 4) {
      cftx020(in_RSI);
    }
  }
  else if (in_EDI < 0x21) {
    if (in_EDI == 0x20) {
      cftf161(in_stack_000000b0,in_stack_000000a8);
      bitrv216((double *)ip);
    }
    else {
      cftf081((double *)CONCAT44(n,in_stack_00000020),a);
      bitrv208(in_RSI);
    }
  }
  else {
    cftf1st(in_stack_0000005c,in_stack_00000050,in_stack_00000048);
    n_00 = (int)((ulong)in_RSI >> 0x20);
    if (in_EDI < 0x201) {
      if (in_EDI < 0x81) {
        cftfx41(n_00,in_RDX,in_ECX,in_R8);
      }
      else {
        cftleaf(n_00,(int)in_RSI,in_RDX,in_ECX,in_R8);
      }
    }
    else {
      cftrec4(w._4_4_,(double *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),n_00,in_RDX);
    }
    bitrv2(in_EDI,(int *)in_RDX,in_RSI);
  }
  return;
}

Assistant:

void cftfsub(int n, double *a, int *ip, int nw, double *w) {
#if 0
  void bitrv2(int n, int *ip, double *a);
  void bitrv216(double *a);
  void bitrv208(double *a);
  void cftf1st(int n, double *a, double *w);
  void cftrec4(int n, double *a, int nw, double *w);
  void cftleaf(int n, int isplt, double *a, int nw, double *w);
  void cftfx41(int n, double *a, int nw, double *w);
  void cftf161(double *a, double *w);
  void cftf081(double *a, double *w);
  void cftf040(double *a);
  void cftx020(double *a);
#endif

  if (n > 8) {
    if (n > 32) {
      cftf1st(n, a, &w[nw - (n >> 2)]);
    if (n > 512) {
      cftrec4(n, a, nw, w);
    } else if (n > 128) {
      cftleaf(n, 1, a, nw, w);
    } else {
      cftfx41(n, a, nw, w);
    }
      bitrv2(n, ip, a);
    } else if (n == 32) {
      cftf161(a, &w[nw - 8]);
      bitrv216(a);
    } else {
      cftf081(a, w);
      bitrv208(a);
    }
  } else if (n == 8) {
    cftf040(a);
  } else if (n == 4) {
    cftx020(a);
  }
}